

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-tcp-oob.c
# Opt level: O1

int run_test_tcp_oob(void)

{
  int iVar1;
  int extraout_EAX;
  undefined8 extraout_RAX;
  ssize_t sVar2;
  int *piVar3;
  undefined1 (*extraout_RDX) [16];
  uv_tcp_t *unaff_RBX;
  int iVar4;
  uv_connect_t *puVar5;
  uv_tcp_t *puVar6;
  undefined1 auVar7 [16];
  sockaddr_in addr;
  undefined8 uStack_30;
  uv_tcp_t *puStack_28;
  undefined1 auStack_18 [16];
  
  puVar5 = (uv_connect_t *)0x194b6a;
  iVar4 = 0x23a3;
  iVar1 = uv_ip4_addr("127.0.0.1",0x23a3,auStack_18);
  if (iVar1 == 0) {
    unaff_RBX = (uv_tcp_t *)uv_default_loop();
    iVar4 = 0x31e220;
    puVar5 = (uv_connect_t *)unaff_RBX;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_00172be4;
    iVar4 = 0x31e318;
    puVar5 = (uv_connect_t *)unaff_RBX;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_00172be9;
    iVar4 = 0x31e410;
    puVar5 = (uv_connect_t *)unaff_RBX;
    iVar1 = uv_tcp_init();
    if (iVar1 != 0) goto LAB_00172bee;
    iVar4 = 0x31e508;
    puVar5 = (uv_connect_t *)unaff_RBX;
    iVar1 = uv_idle_init();
    if (iVar1 != 0) goto LAB_00172bf3;
    puVar6 = &server_handle;
    iVar4 = (int)auStack_18;
    iVar1 = uv_tcp_bind(&server_handle,auStack_18,0);
    puVar5 = (uv_connect_t *)puVar6;
    if (iVar1 != 0) goto LAB_00172bf8;
    puVar6 = &server_handle;
    iVar4 = 1;
    iVar1 = uv_listen(&server_handle,1,connection_cb);
    puVar5 = (uv_connect_t *)puVar6;
    if (iVar1 != 0) goto LAB_00172bfd;
    puVar6 = &client_handle;
    iVar4 = 1;
    iVar1 = uv_tcp_nodelay();
    puVar5 = (uv_connect_t *)puVar6;
    if (iVar1 != 0) goto LAB_00172c02;
    puVar5 = &connect_req;
    iVar4 = 0x31e318;
    iVar1 = uv_tcp_connect(&connect_req,&client_handle,auStack_18,connect_cb);
    if (iVar1 != 0) goto LAB_00172c07;
    iVar4 = 0;
    puVar5 = (uv_connect_t *)unaff_RBX;
    iVar1 = uv_run();
    if (iVar1 != 0) goto LAB_00172c0c;
    if (ticks != 10) goto LAB_00172c11;
    unaff_RBX = (uv_tcp_t *)uv_default_loop();
    uv_walk(unaff_RBX,close_walk_cb,0);
    iVar4 = 0;
    uv_run(unaff_RBX);
    puVar5 = (uv_connect_t *)uv_default_loop();
    iVar1 = uv_loop_close();
    if (iVar1 == 0) {
      return 0;
    }
  }
  else {
    run_test_tcp_oob_cold_1();
LAB_00172be4:
    run_test_tcp_oob_cold_2();
LAB_00172be9:
    run_test_tcp_oob_cold_3();
LAB_00172bee:
    run_test_tcp_oob_cold_4();
LAB_00172bf3:
    run_test_tcp_oob_cold_5();
LAB_00172bf8:
    run_test_tcp_oob_cold_6();
LAB_00172bfd:
    run_test_tcp_oob_cold_7();
LAB_00172c02:
    run_test_tcp_oob_cold_8();
LAB_00172c07:
    run_test_tcp_oob_cold_9();
LAB_00172c0c:
    run_test_tcp_oob_cold_10();
LAB_00172c11:
    run_test_tcp_oob_cold_11();
  }
  run_test_tcp_oob_cold_12();
  puStack_28 = unaff_RBX;
  if (iVar4 == 0) {
    iVar4 = 0x31e410;
    uStack_30 = extraout_RAX;
    iVar1 = uv_accept();
    puVar6 = (uv_tcp_t *)puVar5;
    if (iVar1 != 0) goto LAB_00172d18;
    puVar6 = &peer_handle;
    iVar4 = 0x172d59;
    iVar1 = uv_read_start(&peer_handle,alloc_cb,read_cb);
    if (iVar1 != 0) goto LAB_00172d1d;
    puVar6 = &client_handle;
    iVar4 = (int)&uStack_30 + 4;
    iVar1 = uv_fileno();
    if (iVar1 != 0) goto LAB_00172d22;
    puVar6 = &client_handle;
    iVar4 = 1;
    iVar1 = uv_stream_set_blocking();
    if (iVar1 != 0) goto LAB_00172d27;
    do {
      puVar6 = (uv_tcp_t *)(ulong)uStack_30._4_4_;
      iVar4 = 0x18d3fb;
      sVar2 = send(uStack_30._4_4_,"hello",5,1);
      if (-1 < (int)sVar2) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    if ((int)sVar2 != 5) goto LAB_00172d2c;
    do {
      puVar6 = (uv_tcp_t *)(ulong)uStack_30._4_4_;
      iVar4 = 0x18d3fb;
      sVar2 = send(uStack_30._4_4_,"hello",5,1);
      if (-1 < (int)sVar2) break;
      piVar3 = __errno_location();
    } while (*piVar3 == 4);
    if ((int)sVar2 == 5) {
      puVar6 = &client_handle;
      iVar4 = 0;
      iVar1 = uv_stream_set_blocking();
      if (iVar1 == 0) {
        return 0;
      }
      goto LAB_00172d36;
    }
  }
  else {
    connection_cb_cold_1();
    puVar6 = (uv_tcp_t *)puVar5;
LAB_00172d18:
    connection_cb_cold_2();
LAB_00172d1d:
    connection_cb_cold_3();
LAB_00172d22:
    connection_cb_cold_4();
LAB_00172d27:
    connection_cb_cold_5();
LAB_00172d2c:
    connection_cb_cold_6();
  }
  connection_cb_cold_7();
LAB_00172d36:
  connection_cb_cold_8();
  if ((uv_tcp_t *)(puVar6->u).reserved[3] == &client_handle) {
    if (iVar4 == 0) {
      return extraout_EAX;
    }
  }
  else {
    connect_cb_cold_1();
  }
  connect_cb_cold_2();
  auVar7 = uv_buf_init(alloc_cb::storage,0x400);
  *extraout_RDX = auVar7;
  return auVar7._0_4_;
}

Assistant:

TEST_IMPL(tcp_oob) {
  struct sockaddr_in addr;
  uv_loop_t* loop;

  ASSERT(0 == uv_ip4_addr("127.0.0.1", TEST_PORT, &addr));
  loop = uv_default_loop();

  ASSERT(0 == uv_tcp_init(loop, &server_handle));
  ASSERT(0 == uv_tcp_init(loop, &client_handle));
  ASSERT(0 == uv_tcp_init(loop, &peer_handle));
  ASSERT(0 == uv_idle_init(loop, &idle));
  ASSERT(0 == uv_tcp_bind(&server_handle, (const struct sockaddr*) &addr, 0));
  ASSERT(0 == uv_listen((uv_stream_t*) &server_handle, 1, connection_cb));

  /* Ensure two separate packets */
  ASSERT(0 == uv_tcp_nodelay(&client_handle, 1));

  ASSERT(0 == uv_tcp_connect(&connect_req,
                             &client_handle,
                             (const struct sockaddr*) &addr,
                             connect_cb));
  ASSERT(0 == uv_run(loop, UV_RUN_DEFAULT));

  ASSERT(ticks == kMaxTicks);

  MAKE_VALGRIND_HAPPY();
  return 0;
}